

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void close_upvalues(ch_context *context,ch_primitive *last)

{
  ch_upvalue *pcVar1;
  ch_primitive *pcVar2;
  undefined4 uVar3;
  bool bVar4;
  ch_upvalue *upvalue;
  ch_primitive *last_local;
  ch_context *context_local;
  
  while( true ) {
    bVar4 = false;
    if (context->open_upvalues != (ch_upvalue *)0x0) {
      bVar4 = last <= context->open_upvalues->value;
    }
    if (!bVar4) break;
    pcVar1 = context->open_upvalues;
    pcVar2 = pcVar1->value;
    uVar3 = *(undefined4 *)&pcVar2->field_0x4;
    (pcVar1->closed).type = pcVar2->type;
    *(undefined4 *)&(pcVar1->closed).field_0x4 = uVar3;
    (pcVar1->closed).field_1 = pcVar2->field_1;
    pcVar1->value = &pcVar1->closed;
    context->open_upvalues = pcVar1->next;
  }
  return;
}

Assistant:

static void close_upvalues(ch_context* context, ch_primitive* last) {
  while(context->open_upvalues != NULL && context->open_upvalues->value >= last) {
    ch_upvalue* upvalue = context->open_upvalues;
    upvalue->closed = *upvalue->value;
    upvalue->value = &upvalue->closed;
    context->open_upvalues = upvalue->next;
  }
}